

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Own<const_kj::WritableFileMapping,_std::nullptr_t> __thiscall
kj::anon_unknown_59::InMemoryFile::mmapWritable(InMemoryFile *this,uint64_t offset,uint64_t size)

{
  uchar *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  Impl *pIVar4;
  _func_int **pp_Var5;
  long in_RCX;
  WritableFileMapping *extraout_RDX;
  AtomicRefcounted *refcounted;
  Own<const_kj::WritableFileMapping,_std::nullptr_t> OVar6;
  Fault f;
  uint64_t end;
  uint64_t offset_local;
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> lock;
  
  lock.ptr = (Impl *)&offset_local;
  end = in_RCX + size;
  lock.mutex = (Mutex *)&end;
  offset_local = size;
  if (size <= end) {
    MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl>::lockExclusive
              ((MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl> *)&lock,offset + 0x18);
    pIVar4 = lock.ptr;
    Impl::ensureCapacity(lock.ptr,end);
    uVar3 = offset_local;
    uVar2 = end;
    LOCK();
    *(int *)(offset + 0x10) = *(int *)(offset + 0x10) + 1;
    UNLOCK();
    puVar1 = (pIVar4->bytes).ptr;
    f.exception = (Exception *)(offset + 8);
    pp_Var5 = (_func_int **)operator_new(0x28);
    *pp_Var5 = (_func_int *)&PTR_get_0025fed8;
    pp_Var5[1] = (_func_int *)(offset + 8);
    pp_Var5[2] = (_func_int *)offset;
    pp_Var5[3] = (_func_int *)(puVar1 + uVar3);
    pp_Var5[4] = (_func_int *)(uVar2 - uVar3);
    *(int *)(offset + 0x60) = *(int *)(offset + 0x60) + 1;
    (this->super_File).super_ReadableFile.super_FsNode._vptr_FsNode =
         (_func_int **)
         &_::HeapDisposer<kj::(anonymous_namespace)::InMemoryFile::WritableFileMappingImpl>::
          instance;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = pp_Var5;
    Own<const_kj::(anonymous_namespace)::InMemoryFile,_std::nullptr_t>::~Own
              ((Own<const_kj::(anonymous_namespace)::InMemoryFile,_std::nullptr_t> *)&f);
    Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::~Locked(&lock);
    OVar6.ptr = extraout_RDX;
    OVar6.disposer = (Disposer *)this;
    return OVar6;
  }
  _::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&,char_const(&)[40]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
             ,0x36a,FAILED,"end >= offset",
             "_kjCondition,\"mmapWritable() request overflows uint64\"",
             (DebugComparison<unsigned_long_&,_unsigned_long_&> *)&lock,
             (char (*) [40])"mmapWritable() request overflows uint64");
  _::Debug::Fault::fatal(&f);
}

Assistant:

Own<const WritableFileMapping> mmapWritable(uint64_t offset, uint64_t size) const override {
    uint64_t end = offset + size;
    KJ_REQUIRE(end >= offset, "mmapWritable() request overflows uint64");
    auto lock = impl.lockExclusive();
    lock->ensureCapacity(end);
    return heap<WritableFileMappingImpl>(atomicAddRef(*this), lock->bytes.slice(offset, end));
  }